

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtVM.c
# Opt level: O2

newtRef NVMMessageSendWithValist
                  (newtRefArg impl,newtRefArg receiver,newtRefArg fn,int argc,__va_list_tag *ap)

{
  newtRef nVar1;
  vm_env_t saveVM;
  
  memcpy(&saveVM,&vm_env,0xb0);
  vm_env.next = &saveVM;
  stk_push_varg(argc,ap);
  NVMMessageSend(impl,receiver,fn,(int16_t)argc);
  NVMLoop(vm_env.callstack.sp - 1);
  if (vm_env.reg.sp == 0) {
    nVar1 = 2;
  }
  else {
    nVar1 = *(newtRef *)((long)vm_env.stack.stackp + (ulong)(vm_env.reg.sp - 1) * 8);
  }
  if (vm_env.next != (vm_env_t *)0x0) {
    memcpy(&vm_env,vm_env.next,0xb0);
  }
  return nVar1;
}

Assistant:

newtRef NVMMessageSendWithValist(newtRefArg impl, newtRefArg receiver, newtRefArg fn, int argc, va_list ap)
{
    newtRefVar	result;
    vm_env_t	saveVM;

    // save the VM
    vm_env_push(&saveVM);

    // Push the arguments on the stack
    stk_push_varg(argc, ap);

    // Send the message
    NVMMessageSend(impl, receiver, fn, argc);
    NVMLoop(CALLSP - 1);
    result = stk_top();

    /* restore the VM */
    vm_env_pop();

    return result;
}